

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O0

void cursor_hidden_bitmap(int x,int y)

{
  uint uVar1;
  sbyte sVar2;
  int iVar4;
  uint *puVar5;
  long lVar6;
  bool bVar7;
  uint local_178;
  int local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_f8;
  int local_f4;
  uint local_f0;
  uint local_ec;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_40;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  DLword *dstbase;
  DLword *srcbase;
  int y_local;
  int x_local;
  sbyte sVar3;
  
  dstbase = DisplayRegion68k + y * ((int)displaywidth / 0x10);
  cursor_hidden_bitmap::dx = 0;
  if ((int)displaywidth < x + 0x10) {
    cursor_hidden_bitmap::w = displaywidth - x;
  }
  else {
    cursor_hidden_bitmap::w = 0x10;
  }
  if ((int)displayheight < y + 0x10) {
    cursor_hidden_bitmap::h = displayheight - y;
  }
  else {
    cursor_hidden_bitmap::h = 0x10;
  }
  cursor_hidden_bitmap::srcbpl = displaywidth;
  cursor_hidden_bitmap::dstbpl = 0x10;
  cursor_hidden_bitmap::op = 0;
  srcRmask = 0;
  dstdata = 0;
  OrigSrcAddr._4_4_ = 0;
  OrigDstAddr = (uint *)0x0;
  srcRshift = 0;
  local_b0 = 0;
  src32lbit = cursor_hidden_bitmap::h;
  bVar7 = cursor_hidden_bitmap::backwardflg != 0;
  LastCursorClippingX = cursor_hidden_bitmap::w;
  LastCursorClippingY = cursor_hidden_bitmap::h;
  cursor_hidden_bitmap::sx = x;
  if (cursor_hidden_bitmap::gray == 0) {
    if (bVar7) {
      uVar1 = cursor_hidden_bitmap::w - 1;
      if ((int)uVar1 < 0) {
        lVar6 = -(long)((int)(7 - uVar1) >> 3);
      }
      else {
        lVar6 = (long)((int)uVar1 >> 3);
      }
      x32nbyt = (long)MonoCursor_savebitmap + lVar6;
      _preloop_mask = (DLword *)(x32nbyt - (x32nbyt & 3));
      fwd = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
      dstold = (fwd - cursor_hidden_bitmap::w) + 1U & 0x1f;
      sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
      if (dstold == 0) {
        local_f0 = 0xffffffff;
      }
      else {
        local_f0 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      dst32addr._4_4_ = local_f0;
      dst32addr._0_4_ = sdw_mask & local_f0;
      if ((cursor_hidden_bitmap::w - fwd) + -1 < 1) {
        local_f4 = 0;
      }
      else {
        local_f4 = (cursor_hidden_bitmap::w - fwd) + -1 >> 5;
      }
      srcLshift = local_f4;
      uVar1 = (x + cursor_hidden_bitmap::w) - 1;
      if ((int)uVar1 < 0) {
        lVar6 = -(long)((int)(7 - uVar1) >> 3);
      }
      else {
        lVar6 = (long)((int)uVar1 >> 3);
      }
      x32nbyt = (long)dstbase + lVar6;
      OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
      OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar1 & 7);
      dst32lbit = (OrigSrcAddr._4_4_ - cursor_hidden_bitmap::w) + 1 & 0x1f;
      local_b0 = dstold - dst32lbit;
      srcRmask = dst32lbit - dstold & 0x1f;
      if (srcRmask == 0) {
        local_f8 = 0;
      }
      else {
        local_f8 = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_f8;
    }
    else {
      _preloop_mask = MonoCursor_savebitmap;
      dstold = 0;
      fwd = cursor_hidden_bitmap::w - 1U & 0x1f;
      sdw_mask = 0xffffffff;
      dst32addr._0_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      srcLshift = (cursor_hidden_bitmap::w >> 5) + -1;
      if (x < 0) {
        lVar6 = -(long)(7 - x >> 3);
      }
      else {
        lVar6 = (long)(x >> 3);
      }
      x32nbyt = (long)dstbase + lVar6;
      OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
      dst32lbit = (int)((x32nbyt & 3) << 3) + (x & 7U);
      OrigSrcAddr._4_4_ = (dst32lbit + cursor_hidden_bitmap::w) - 1U & 0x1f;
      local_b0 = -dst32lbit;
      srcRmask = dst32lbit & 0x1f;
      if (srcRmask == 0) {
        local_ec = 0xffffffff;
      }
      else {
        local_ec = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_ec;
      dst32addr._4_4_ = (uint)dst32addr;
    }
    local_b0 = local_b0 & 0x1f;
    _savedS = OrigDstAddr;
  }
  else {
    _preloop_mask = MonoCursor_savebitmap;
    dstold = 0;
    fwd = cursor_hidden_bitmap::w - 1U & 0x1f;
    sdw_mask = 0xffffffff;
    dst32addr._0_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
    srcLshift = (cursor_hidden_bitmap::w >> 5) + -1;
    dst32lbit = x & 0xf;
    _savedS = OrigDstAddr;
    dst32addr._4_4_ = (uint)dst32addr;
  }
  do {
    src32addr = (uint *)_preloop_mask;
    iVar4 = src32lbit + -1;
    if (src32lbit < 1) {
      return;
    }
    if (cursor_hidden_bitmap::gray == 0) {
      sVar2 = (sbyte)local_b0;
      sVar3 = (sbyte)srcRmask;
      if (bVar7) {
        if ((OrigSrcAddr._4_4_ < (uint)fwd) &&
           ((int)(dstold + 1) < dst32lbit + cursor_hidden_bitmap::w)) {
          puVar5 = _savedS + -1;
          uVar1 = *_savedS;
          _savedS = _savedS + -2;
          newS = uVar1 >> sVar2 & dstdata | *puVar5 << sVar3;
          srcRshift = *puVar5 >> sVar2 & dstdata;
        }
        else {
          if (OrigSrcAddr._4_4_ < (uint)fwd) {
            newS = *_savedS >> sVar2 & dstdata;
          }
          else {
            newS = *_savedS << sVar3;
            srcRshift = *_savedS >> sVar2 & dstdata;
          }
          _savedS = _savedS + -1;
        }
        if (cursor_hidden_bitmap::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        if ((int)(dstold + cursor_hidden_bitmap::w) < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_40 = *(uint *)_preloop_mask;
          uVar1 = local_40 & ~sdw_mask;
          switch(cursor_hidden_bitmap::op) {
          case 0:
            local_40 = newS;
            break;
          case 1:
            local_40 = newS & local_40;
            break;
          case 2:
            local_40 = newS | local_40;
            break;
          case 3:
            local_40 = newS ^ local_40;
          }
          *(uint *)_preloop_mask = uVar1 | sdw_mask & local_40;
          src32addr = (uint *)((long)_preloop_mask + -4);
          if (dst32lbit == dstold) {
            if (cursor_hidden_bitmap::src_comp == 0) {
              switch(cursor_hidden_bitmap::op) {
              case 0:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_cc = srcLshift;
                while (local_cc = local_cc + -1, -1 < local_cc) {
                  *src32addr = *_savedS ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(cursor_hidden_bitmap::op) {
              case 0:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_c8 = srcLshift;
                while (local_c8 = local_c8 + -1, -1 < local_c8) {
                  *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
          }
          else if (cursor_hidden_bitmap::src_comp == 0) {
            switch(cursor_hidden_bitmap::op) {
            case 0:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_d4 = srcLshift;
              while (local_d4 = local_d4 + -1, -1 < local_d4) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          else {
            switch(cursor_hidden_bitmap::op) {
            case 0:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_d0 = srcLshift;
              while (local_d0 = local_d0 + -1, -1 < local_d0) {
                uVar1 = srcRshift | *_savedS << sVar3;
                srcRshift = *_savedS >> sVar2;
                *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          if (dstold == 0) goto LAB_00148cfe;
          if ((uint)dst32lbit < dstold) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS << sVar3;
          }
          if (cursor_hidden_bitmap::src_comp != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
        }
        goto LAB_00148c6a;
      }
      if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + cursor_hidden_bitmap::w)) {
        puVar5 = _savedS + 1;
        uVar1 = *_savedS;
        _savedS = _savedS + 2;
        newS = uVar1 << sVar3 | *puVar5 >> sVar2 & dstdata;
        srcRshift = *puVar5 << sVar3 & (dstdata ^ 0xffffffff);
      }
      else {
        if (dstold < (uint)dst32lbit) {
          newS = *_savedS << sVar3;
        }
        else {
          newS = *_savedS >> sVar2 & dstdata;
          srcRshift = *_savedS << sVar3 & (dstdata ^ 0xffffffff);
        }
        _savedS = _savedS + 1;
      }
      if (cursor_hidden_bitmap::src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + cursor_hidden_bitmap::w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
        goto LAB_00148c6a;
      }
      local_40 = *(uint *)_preloop_mask;
      uVar1 = local_40 & ~sdw_mask;
      switch(cursor_hidden_bitmap::op) {
      case 0:
        local_40 = newS;
        break;
      case 1:
        local_40 = newS & local_40;
        break;
      case 2:
        local_40 = newS | local_40;
        break;
      case 3:
        local_40 = newS ^ local_40;
      }
      *(uint *)_preloop_mask = uVar1 | sdw_mask & local_40;
      src32addr = (uint *)((long)_preloop_mask + 4);
      if (dst32lbit == dstold) {
        if (cursor_hidden_bitmap::src_comp == 0) {
          switch(cursor_hidden_bitmap::op) {
          case 0:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_bc = srcLshift;
            while (local_bc = local_bc + -1, -1 < local_bc) {
              *src32addr = *_savedS ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(cursor_hidden_bitmap::op) {
          case 0:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_b8 = srcLshift;
            while (local_b8 = local_b8 + -1, -1 < local_b8) {
              *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
      }
      else if (cursor_hidden_bitmap::src_comp == 0) {
        switch(cursor_hidden_bitmap::op) {
        case 0:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_c4 = srcLshift;
          while (local_c4 = local_c4 + -1, -1 < local_c4) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      else {
        switch(cursor_hidden_bitmap::op) {
        case 0:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_c0 = srcLshift;
          while (local_c0 = local_c0 + -1, -1 < local_c0) {
            uVar1 = srcRshift | *_savedS >> sVar2;
            srcRshift = *_savedS << sVar3;
            *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      if (fwd != 0x1f) {
        if ((uint)fwd < OrigSrcAddr._4_4_) {
          newS = srcRshift;
        }
        else {
          newS = srcRshift | *_savedS >> sVar2 & dstdata;
        }
        if (cursor_hidden_bitmap::src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        x32byta._4_4_ = dst32addr._4_4_;
        goto LAB_00148c6a;
      }
    }
    else {
      srcRmask = dst32lbit - dstold & 0xf;
      uVar1 = CONCAT22(*dstbase,*dstbase) << (sbyte)srcRmask;
      newS = uVar1 >> 0x10 | uVar1;
      if (cursor_hidden_bitmap::src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + cursor_hidden_bitmap::w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
      }
      else {
        local_40 = *(uint *)_preloop_mask;
        uVar1 = local_40 & ~sdw_mask;
        switch(cursor_hidden_bitmap::op) {
        case 0:
          local_40 = newS;
          break;
        case 1:
          local_40 = newS & local_40;
          break;
        case 2:
          local_40 = newS | local_40;
          break;
        case 3:
          local_40 = newS ^ local_40;
        }
        *(uint *)_preloop_mask = local_40 & sdw_mask | uVar1;
        src32addr = (uint *)((long)_preloop_mask + 4);
        switch(cursor_hidden_bitmap::op) {
        case 0:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS & *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS | *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_b4 = srcLshift;
          while (local_b4 = local_b4 + -1, -1 < local_b4) {
            *src32addr = newS ^ *src32addr;
            src32addr = src32addr + 1;
          }
        }
        if (fwd == 0x1f) goto LAB_00148cfe;
        x32byta._4_4_ = dst32addr._4_4_;
      }
LAB_00148c6a:
      local_40 = *src32addr;
      uVar1 = local_40 & ~x32byta._4_4_;
      switch(cursor_hidden_bitmap::op) {
      case 0:
        local_40 = newS;
        break;
      case 1:
        local_40 = newS & local_40;
        break;
      case 2:
        local_40 = newS | local_40;
        break;
      case 3:
        local_40 = newS ^ local_40;
      }
      *src32addr = uVar1 | x32byta._4_4_ & local_40;
    }
LAB_00148cfe:
    src32lbit = iVar4;
    if (cursor_hidden_bitmap::gray == 0) {
      if (bVar7) {
        uVar1 = cursor_hidden_bitmap::dstbpl + fwd;
        if ((int)uVar1 < 0) {
          lVar6 = (long)((int)(0x1f - uVar1) >> 5) * -4;
        }
        else {
          lVar6 = 0;
        }
        fwd = uVar1 & 0x1f;
        dstold = (fwd - cursor_hidden_bitmap::w) + 1U & 0x1f;
        sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
        if (dstold == 0) {
          local_170 = 0xffffffff;
        }
        else {
          local_170 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._0_4_ = sdw_mask & local_170;
        if ((cursor_hidden_bitmap::w - fwd) + -1 < 1) {
          local_174 = 0;
        }
        else {
          local_174 = (cursor_hidden_bitmap::w - fwd) + -1 >> 5;
        }
        srcLshift = local_174;
        dst32addr._4_4_ = local_170;
        src32addr = (uint *)((long)_preloop_mask + lVar6);
        uVar1 = cursor_hidden_bitmap::srcbpl + OrigSrcAddr._4_4_;
        if ((int)uVar1 < 0) {
          lVar6 = (long)((int)(0x1f - uVar1) >> 5) * -4;
        }
        else {
          lVar6 = (long)((int)uVar1 >> 5) * 4;
        }
        OrigSrcAddr._4_4_ = uVar1 & 0x1f;
        dst32lbit = (OrigSrcAddr._4_4_ - cursor_hidden_bitmap::w) + 1 & 0x1f;
        local_b0 = dstold - dst32lbit & 0x1f;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_178 = 0;
        }
        else {
          local_178 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_178;
        _savedS = (uint *)((long)OrigDstAddr + lVar6);
        _preloop_mask = (DLword *)src32addr;
        OrigDstAddr = _savedS;
      }
      else {
        uVar1 = cursor_hidden_bitmap::dstbpl + dstold;
        dstold = uVar1 & 0x1f;
        fwd = (dstold + cursor_hidden_bitmap::w) - 1 & 0x1f;
        if (dstold == 0) {
          local_168 = 0xffffffff;
        }
        else {
          local_168 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_168 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + cursor_hidden_bitmap::w) >> 5) + -1;
        sdw_mask = local_168;
        _preloop_mask = (DLword *)((long)_preloop_mask + (long)((int)uVar1 >> 5) * 4);
        uVar1 = cursor_hidden_bitmap::srcbpl + dst32lbit;
        dst32lbit = uVar1 & 0x1f;
        OrigSrcAddr._4_4_ = (dst32lbit + cursor_hidden_bitmap::w) - 1U & 0x1f;
        local_b0 = dstold - dst32lbit & 0x1f;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_16c = 0xffffffff;
        }
        else {
          local_16c = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_16c;
        OrigDstAddr = OrigDstAddr + ((int)uVar1 >> 5);
        _savedS = OrigDstAddr;
      }
    }
    else {
      uVar1 = cursor_hidden_bitmap::dstbpl + dstold;
      dstold = uVar1 & 0x1f;
      fwd = (dstold + cursor_hidden_bitmap::w) - 1 & 0x1f;
      if (dstold == 0) {
        local_164 = 0xffffffff;
      }
      else {
        local_164 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_164;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_164 & dst32addr._4_4_;
      srcLshift = ((int)(dstold + cursor_hidden_bitmap::w) >> 5) + -1;
      _preloop_mask = (DLword *)((long)_preloop_mask + (long)((int)uVar1 >> 5) * 4);
      cursor_hidden_bitmap::curr_gray_line = cursor_hidden_bitmap::curr_gray_line + 1;
      if (cursor_hidden_bitmap::curr_gray_line < cursor_hidden_bitmap::num_gray) {
        dstbase = dstbase + 1;
      }
      else {
        cursor_hidden_bitmap::curr_gray_line = 0;
        dstbase = dstbase + -(long)(cursor_hidden_bitmap::num_gray + -1);
      }
    }
  } while( true );
}

Assistant:

void cursor_hidden_bitmap(int x, int y)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  /* save image */
  srcbase = DisplayRegion68k + (y * DLWORD_PERLINE);
  dstbase = MonoCursor_savebitmap;
  sx = x;
  dx = 0;
  CursorClippingX(x, w); /* w and LastCursorClippingX rest */
  CursorClippingY(y, h); /* h and LastCursorClippingY reset */
  srcbpl = displaywidth;
  dstbpl = HARD_CURSORWIDTH;
  op = 0; /* replace */
  new_bitblt_code;
}